

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O3

void png_read_rows(png_structrp png_ptr,png_bytepp row,png_bytepp display_row,png_uint_32 num_rows)

{
  long lVar1;
  
  if (png_ptr != (png_structrp)0x0) {
    if (display_row == (png_bytepp)0x0 || row == (png_bytepp)0x0) {
      if (row == (png_bytepp)0x0) {
        if (num_rows != 0 && display_row != (png_bytepp)0x0) {
          lVar1 = 0;
          do {
            png_read_row(png_ptr,(png_bytep)0x0,display_row[lVar1]);
            lVar1 = lVar1 + 1;
          } while (num_rows != (png_uint_32)lVar1);
        }
      }
      else if (num_rows != 0) {
        lVar1 = 0;
        do {
          png_read_row(png_ptr,row[lVar1],(png_bytep)0x0);
          lVar1 = lVar1 + 1;
        } while (num_rows != (png_uint_32)lVar1);
      }
    }
    else if (num_rows != 0) {
      lVar1 = 0;
      do {
        png_read_row(png_ptr,row[lVar1],display_row[lVar1]);
        lVar1 = lVar1 + 1;
      } while (num_rows != (png_uint_32)lVar1);
    }
  }
  return;
}

Assistant:

void PNGAPI
png_read_rows(png_structrp png_ptr, png_bytepp row,
    png_bytepp display_row, png_uint_32 num_rows)
{
   png_uint_32 i;
   png_bytepp rp;
   png_bytepp dp;

   png_debug(1, "in png_read_rows");

   if (png_ptr == NULL)
      return;

   rp = row;
   dp = display_row;
   if (rp != NULL && dp != NULL)
      for (i = 0; i < num_rows; i++)
      {
         png_bytep rptr = *rp++;
         png_bytep dptr = *dp++;

         png_read_row(png_ptr, rptr, dptr);
      }

   else if (rp != NULL)
      for (i = 0; i < num_rows; i++)
      {
         png_bytep rptr = *rp;
         png_read_row(png_ptr, rptr, NULL);
         rp++;
      }

   else if (dp != NULL)
      for (i = 0; i < num_rows; i++)
      {
         png_bytep dptr = *dp;
         png_read_row(png_ptr, NULL, dptr);
         dp++;
      }
}